

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::EmbedVideo::EmbedVideo(EmbedVideo *this,EmbedVideo *param_1)

{
  EmbedVideo *param_1_local;
  EmbedVideo *this_local;
  
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->url,&param_1->url);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->proxy_url,&param_1->proxy_url);
  omittable_field<int>::omittable_field(&this->height,&param_1->height);
  omittable_field<int>::omittable_field(&this->width,&param_1->width);
  return;
}

Assistant:

EmbedVideo(
        omittable_field<std::string> url = omitted,
        omittable_field<std::string> proxy_url = omitted,
        omittable_field<int> height = omitted,
        omittable_field<int> width = omitted
    ):
        url(url),
        proxy_url(proxy_url),
        height(height),
        width(width)
    {}